

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_183::Flower::filterGlobalContents
          (Flower *this,PossibleContents *contents,GlobalLocation *globalLoc)

{
  bool bVar1;
  Type in_R8;
  Name name;
  PossibleContents local_58;
  size_t local_38;
  char *local_30;
  Global *local_28;
  Global *global;
  GlobalLocation *globalLoc_local;
  PossibleContents *contents_local;
  Flower *this_local;
  
  local_38 = (globalLoc->name).super_IString.str._M_len;
  local_30 = (globalLoc->name).super_IString.str._M_str;
  global = (Global *)globalLoc;
  globalLoc_local = (GlobalLocation *)contents;
  contents_local = (PossibleContents *)this;
  local_28 = Module::getGlobal(this->wasm,(Name)(globalLoc->name).super_IString.str);
  if (((local_28->mutable_ & 1U) == 0) &&
     ((bVar1 = PossibleContents::isMany((PossibleContents *)globalLoc_local), bVar1 ||
      (bVar1 = PossibleContents::isConeType((PossibleContents *)globalLoc_local), bVar1)))) {
    name.super_IString.str._M_str = (char *)(local_28->type).id;
    name.super_IString.str._M_len =
         (size_t)(local_28->super_Importable).super_Named.name.super_IString.str._M_str;
    PossibleContents::global
              (&local_58,
               (PossibleContents *)
               (local_28->super_Importable).super_Named.name.super_IString.str._M_len,name,in_R8);
    PossibleContents::operator=((PossibleContents *)globalLoc_local,&local_58);
    PossibleContents::~PossibleContents(&local_58);
  }
  return;
}

Assistant:

void Flower::filterGlobalContents(PossibleContents& contents,
                                  const GlobalLocation& globalLoc) {
  auto* global = wasm.getGlobal(globalLoc.name);
  if (global->mutable_ == Immutable) {
    // This is an immutable global. We never need to consider this value as
    // "Many", since in the worst case we can just use the immutable value. That
    // is, we can always replace this value with (global.get $name) which will
    // get the right value. Likewise, using the immutable global value is often
    // better than a cone type (even an exact one), but TODO: we could note both
    // a cone/exact type *and* that something is equal to a global, in some
    // cases. See https://github.com/WebAssembly/binaryen/pull/5083
    if (contents.isMany() || contents.isConeType()) {
      contents = PossibleContents::global(global->name, global->type);

      // TODO: We could do better here, to set global->init->type instead of
      //       global->type, or even the contents.getType() - either of those
      //       may be more refined. But other passes will handle that in
      //       general (by refining the global's type).

#if defined(POSSIBLE_CONTENTS_DEBUG) && POSSIBLE_CONTENTS_DEBUG >= 2
      std::cout << "  setting immglobal to ImmutableGlobal\n";
      contents.dump(std::cout, &wasm);
      std::cout << '\n';
#endif
    }
  }
}